

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O1

word ppMulW(word *b,word *a,size_t n,word w,void *stack)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  
  *(undefined8 *)stack = 0;
  *(word *)((long)stack + 8) = w;
  uVar3 = w * 2;
  *(ulong *)((long)stack + 0x10) = uVar3;
  uVar6 = uVar3 ^ w;
  *(ulong *)((long)stack + 0x18) = uVar6;
  uVar1 = w * 4;
  *(ulong *)((long)stack + 0x20) = uVar1;
  *(ulong *)((long)stack + 0x28) = uVar1 ^ w;
  *(ulong *)((long)stack + 0x30) = uVar6 * 2;
  uVar8 = uVar6 * 2 ^ w;
  *(ulong *)((long)stack + 0x38) = uVar8;
  uVar2 = w * 8;
  *(ulong *)((long)stack + 0x40) = uVar2;
  *(ulong *)((long)stack + 0x48) = uVar2 ^ w;
  uVar5 = (uVar1 ^ w) * 2;
  *(ulong *)((long)stack + 0x50) = uVar5;
  *(ulong *)((long)stack + 0x58) = uVar5 ^ w;
  *(ulong *)((long)stack + 0x60) = uVar6 << 2;
  *(ulong *)((long)stack + 0x68) = uVar6 << 2 ^ w;
  uVar8 = uVar8 * 2;
  *(ulong *)((long)stack + 0x70) = uVar8;
  *(ulong *)((long)stack + 0x78) = uVar8 ^ w;
  if (n == 0) {
    uVar5 = 0;
  }
  else {
    sVar7 = 0;
    uVar5 = 0;
    do {
      uVar8 = *(long *)((long)stack + (a[sVar7] >> 0x3c) * 8) << 4 ^
              *(ulong *)((long)stack + (ulong)((byte)(a[sVar7] >> 0x38) & 0xf) * 8);
      *(ulong *)((long)stack + 0x80) = uVar8;
      *(ulong *)((long)stack + 0x88) = uVar8 >> 0x38;
      uVar6 = *(long *)((long)stack + (ulong)((uint)(a[sVar7] >> 0x34) & 0xf) * 8) << 4 ^ uVar8 << 8
              ^ *(ulong *)((long)stack + (ulong)((ushort)(a[sVar7] >> 0x30) & 0xf) * 8);
      *(ulong *)((long)stack + 0x80) = uVar6;
      uVar9 = (uVar8 >> 0x38) << 8 | uVar6 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar9;
      uVar4 = (uint)(a[sVar7] >> 0x20);
      uVar8 = *(long *)((long)stack + (ulong)(uVar4 >> 0xc & 0xf) * 8) << 4 ^ uVar6 << 8 ^
              *(ulong *)((long)stack + (ulong)(uVar4 >> 8 & 0xf) * 8);
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = uVar9 << 8 | uVar8 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar4 = (uint)(a[sVar7] >> 0x20);
      uVar8 = *(long *)((long)stack + (ulong)(uVar4 >> 4 & 0xf) * 8) << 4 ^ uVar8 << 8 ^
              *(ulong *)((long)stack + (ulong)(uVar4 & 0xf) * 8);
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = uVar6 << 8 | uVar8 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar8 = *(long *)((long)stack + (ulong)((uint)a[sVar7] >> 0x1c) * 8) << 4 ^ uVar8 << 8 ^
              *(ulong *)((long)stack + (ulong)((uint)a[sVar7] >> 0x15 & 0x78));
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = uVar6 << 8 | uVar8 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar8 = *(long *)((long)stack + (ulong)((uint)a[sVar7] >> 0x11 & 0x78)) << 4 ^ uVar8 << 8 ^
              *(ulong *)((long)stack + (ulong)((uint)a[sVar7] >> 0xd & 0x78));
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = uVar6 << 8 | uVar8 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar8 = *(long *)((long)stack + (ulong)((uint)a[sVar7] >> 9 & 0x78)) << 4 ^ uVar8 << 8 ^
              *(ulong *)((long)stack + (ulong)((uint)a[sVar7] >> 5 & 0x78));
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = uVar6 << 8 | uVar8 >> 0x38;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar8 = *(long *)((long)stack + (ulong)((uint)a[sVar7] >> 1 & 0x78)) << 4 ^ uVar8 << 8 ^
              *(ulong *)((long)stack + (ulong)((uint)a[sVar7] & 0xf) * 8);
      *(ulong *)((long)stack + 0x80) = uVar8;
      uVar6 = a[sVar7] >> 1 & (long)w >> 0x3f & 0x7f7f7f7f7f7f7f7fU ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar6 = a[sVar7] >> 2 & (long)uVar3 >> 0x3f & 0x3f3f3f3f3f3f3f3fU ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar6 = a[sVar7] >> 3 & (long)uVar1 >> 0x3f & 0x1f1f1f1f1f1f1f1fU ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar6 = a[sVar7] >> 4 & (long)uVar2 >> 0x3f & 0xf0f0f0f0f0f0f0fU ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar6 = a[sVar7] >> 5 & (long)(w << 4) >> 0x3f & 0x707070707070707U ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      uVar6 = a[sVar7] >> 6 & (long)(w << 5) >> 0x3f & 0x303030303030303U ^ uVar6;
      *(ulong *)((long)stack + 0x88) = uVar6;
      *(word *)((long)stack + 0x88) =
           a[sVar7] >> 7 & (long)(w << 6) >> 0x3f & 0x101010101010101U ^ uVar6;
      b[sVar7] = uVar8 ^ uVar5;
      uVar5 = *(ulong *)((long)stack + 0x88);
      sVar7 = sVar7 + 1;
    } while (n != sVar7);
  }
  return uVar5;
}

Assistant:

word ppMulW(word b[], const word a[], size_t n, register word w, 
	void* stack)
{
	register word carry = 0;
	size_t i;
	word* t = (word*)stack;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	_MUL_PRE_S4(t, w);
	for (i = 0; i < n; ++i)
	{
		_MUL_MUL_S4(t[16], t[17], t, a[i]);
		_MUL_REPAIR_S4(t[17], w, a[i]);
		b[i] = carry ^ t[16];
		carry = t[17];
	}
	w = 0;
	return carry;
}